

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbis-read.c
# Opt level: O1

int vorbis_unpack_id_hdr(vorbis_stream_t *vorbis)

{
  uint uVar1;
  unsigned_long uVar2;
  uchar *ptr;
  bv_t bv;
  uchar *local_28;
  bv_t local_20;
  
  if (vorbis == (vorbis_stream_t *)0x0) {
    __assert_fail("vorbis != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",0x22
                  ,"int vorbis_unpack_id_hdr(vorbis_stream_t *)");
  }
  local_28 = (vorbis->id_hdr).data;
  if (local_28 != (uchar *)0x0) {
    if ((vorbis->id_hdr).len == 0x1e) {
      local_28 = local_28 + 7;
      uVar1 = le_uint32_unpack__(&local_28);
      vorbis->vorbis_version = (ulong)uVar1;
      vorbis->audio_channels = *local_28;
      local_28 = local_28 + 1;
      uVar1 = le_uint32_unpack__(&local_28);
      vorbis->audio_sample_rate = (ulong)uVar1;
      uVar1 = le_uint32_unpack__(&local_28);
      vorbis->bitrate_maximum = (ulong)uVar1;
      uVar1 = le_uint32_unpack__(&local_28);
      vorbis->bitrate_nominal = (ulong)uVar1;
      uVar1 = le_uint32_unpack__(&local_28);
      vorbis->bitrate_minimum = (ulong)uVar1;
      bv_init(&local_20,local_28,8);
      uVar2 = bv_get_bits(&local_20,4);
      vorbis->blocksize_1 = (uchar)uVar2;
      uVar2 = bv_get_bits(&local_20,4);
      vorbis->blocksize_0 = (uchar)uVar2;
      uVar1 = 0;
      if (((vorbis->vorbis_version == 0) && (vorbis->audio_channels != '\0')) &&
         (vorbis->audio_sample_rate != 0)) {
        uVar1 = (uint)(((uint)uVar2 & 0xff) <= (uint)vorbis->blocksize_1);
      }
      return uVar1;
    }
    __assert_fail("vorbis->id_hdr.len == VORBIS_ID_HDR_SIZE",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",0x24
                  ,"int vorbis_unpack_id_hdr(vorbis_stream_t *)");
  }
  __assert_fail("vorbis->id_hdr.data != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/vorbis-read.c",0x23,
                "int vorbis_unpack_id_hdr(vorbis_stream_t *)");
}

Assistant:

int vorbis_unpack_id_hdr(vorbis_stream_t *vorbis) {
  assert(vorbis != NULL);
  assert(vorbis->id_hdr.data != NULL);
  assert(vorbis->id_hdr.len == VORBIS_ID_HDR_SIZE);
  
  unsigned char *ptr = vorbis->id_hdr.data + VORBIS_HDR_SIZE;
  vorbis->vorbis_version = LE_UINT32_UNPACK(ptr);
  vorbis->audio_channels = UINT8_UNPACK(ptr);
  vorbis->audio_sample_rate = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_maximum = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_nominal = LE_UINT32_UNPACK(ptr);
  vorbis->bitrate_minimum = LE_UINT32_UNPACK(ptr);

  bv_t bv;
  bv_init(&bv, ptr, 8);
  vorbis->blocksize_1 = bv_get_bits(&bv, 4);
  vorbis->blocksize_0 = bv_get_bits(&bv, 4);

#ifdef DEBUG
  vorbis_stream_print(vorbis);
#endif /* DEBUG */

  if ((vorbis->vorbis_version != 0) ||
      (vorbis->audio_channels == 0) ||
      (vorbis->audio_sample_rate == 0) ||
      (vorbis->blocksize_0 > vorbis->blocksize_1))
    return 0;

  return 1;
}